

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Functional::UniformCase::getUniforms
          (UniformCase *this,
          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
          *valuesDst,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL)

{
  bool bVar1;
  GLint location_00;
  GLenum GVar2;
  deBool dVar3;
  TestLog *this_00;
  size_type sVar4;
  GLchar *name;
  MessageBuilder *pMVar5;
  VarValue *value_00;
  string local_3f0;
  MessageBuilder local_3d0;
  float local_250;
  int local_24c;
  GLint unit;
  int i_1;
  int i;
  undefined1 local_bc [4];
  undefined1 local_b8 [4];
  VarValue value;
  int size;
  undefined1 local_60 [4];
  int location;
  string queryName;
  BasicUniform *uniform;
  int unifNdx;
  bool success;
  TestLog *log;
  deUint32 programGL_local;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  *valuesDst_local;
  UniformCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  uniform._7_1_ = true;
  for (uniform._0_4_ = 0;
      sVar4 = std::
              vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
              ::size(basicUniforms), (int)uniform < (int)sVar4; uniform._0_4_ = (int)uniform + 1) {
    queryName.field_2._8_8_ =
         std::
         vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
         ::operator[](basicUniforms,(long)(int)uniform);
    if (((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 0x80) == 0) ||
       (((const_reference)queryName.field_2._8_8_)->elemNdx != 0)) {
      std::__cxx11::string::string((string *)local_60,(string *)queryName.field_2._8_8_);
    }
    else {
      beforeLast((string *)local_60,(string *)queryName.field_2._8_8_,'[');
    }
    name = (GLchar *)std::__cxx11::string::c_str();
    location_00 = glu::CallLogWrapper::glGetUniformLocation
                            (&this->super_CallLogWrapper,programGL,name);
    value.val.floatV[0xe] =
         (float)glu::getDataTypeScalarSize(*(DataType *)(queryName.field_2._8_8_ + 0x20));
    ::deMemset(local_bc,0xcd,0x44);
    if (location_00 == -1) {
      local_bc = (undefined1  [4])0x0;
      std::
      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ::push_back(valuesDst,(value_type *)local_bc);
      if ((*(byte *)(queryName.field_2._8_8_ + 0x24) & 1) != 0) {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&i,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)&i,(char (*) [13])"// FAILURE: ")
        ;
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)queryName.field_2._8_8_);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [41])" was used in shader, but has location -1");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i);
        uniform._7_1_ = false;
      }
      i_1 = 4;
    }
    else {
      local_bc = *(undefined1 (*) [4])(queryName.field_2._8_8_ + 0x20);
      bVar1 = glu::isDataTypeFloatOrVec(*(DataType *)(queryName.field_2._8_8_ + 0x20));
      if ((bVar1) ||
         (bVar1 = glu::isDataTypeMatrix(*(DataType *)(queryName.field_2._8_8_ + 0x20)), bVar1)) {
        do {
          glu::CallLogWrapper::glGetUniformfv
                    (&this->super_CallLogWrapper,programGL,location_00,(GLfloat *)local_b8);
          GVar2 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
          glu::checkError(GVar2,"glGetUniformfv(programGL, location, &value.val.floatV[0])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x56e);
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
      }
      else {
        bVar1 = glu::isDataTypeIntOrIVec(*(DataType *)(queryName.field_2._8_8_ + 0x20));
        if (bVar1) {
          do {
            glu::CallLogWrapper::glGetUniformiv
                      (&this->super_CallLogWrapper,programGL,location_00,(GLint *)local_b8);
            GVar2 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
            glu::checkError(GVar2,"glGetUniformiv(programGL, location, &value.val.intV[0])",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                            ,0x570);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
        }
        else {
          bVar1 = glu::isDataTypeBoolOrBVec(*(DataType *)(queryName.field_2._8_8_ + 0x20));
          if (bVar1) {
            if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 0x20) == 0) {
              do {
                glu::CallLogWrapper::glGetUniformfv
                          (&this->super_CallLogWrapper,programGL,location_00,(GLfloat *)local_b8);
                GVar2 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                glu::checkError(GVar2,"glGetUniformfv(programGL, location, &value.val.floatV[0])",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                ,0x57b);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              for (local_24c = 0; local_24c < (int)value.val.floatV[0xe]; local_24c = local_24c + 1)
              {
                local_b8[local_24c] = *(float *)(local_b8 + (long)local_24c * 4) != 0.0;
              }
            }
            else {
              do {
                glu::CallLogWrapper::glGetUniformiv
                          (&this->super_CallLogWrapper,programGL,location_00,(GLint *)local_b8);
                GVar2 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                glu::checkError(GVar2,"glGetUniformiv(programGL, location, &value.val.intV[0])",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                ,0x575);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              for (unit = 0; unit < (int)value.val.floatV[0xe]; unit = unit + 1) {
                local_b8[unit] = *(int *)(local_b8 + (long)unit * 4) != 0;
              }
            }
          }
          else {
            bVar1 = glu::isDataTypeSampler(*(DataType *)(queryName.field_2._8_8_ + 0x20));
            if (bVar1) {
              local_250 = -NAN;
              do {
                glu::CallLogWrapper::glGetUniformiv
                          (&this->super_CallLogWrapper,programGL,location_00,(GLint *)&local_250);
                GVar2 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                glu::checkError(GVar2,"glGetUniformiv(programGL, location, &unit)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                ,0x583);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              local_b8 = (undefined1  [4])local_250;
            }
          }
        }
      }
      std::
      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ::push_back(valuesDst,(value_type *)local_bc);
      tcu::TestLog::operator<<(&local_3d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_3d0,(char (*) [8])"// Got ");
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)queryName.field_2._8_8_);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])0x2ade8a5);
      apiVarValueStr_abi_cxx11_(&local_3f0,(Functional *)local_bc,value_00);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3f0);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_3f0);
      tcu::MessageBuilder::~MessageBuilder(&local_3d0);
      i_1 = 0;
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  return uniform._7_1_;
}

Assistant:

bool UniformCase::getUniforms (vector<VarValue>& valuesDst, const vector<BasicUniform>& basicUniforms, const deUint32 programGL)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const string			queryName	= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				location	= glGetUniformLocation(programGL, queryName.c_str());
		const int				size		= glu::getDataTypeScalarSize(uniform.type);
		VarValue				value;

		deMemset(&value, 0xcd, sizeof(value)); // Initialize to known garbage.

		if (location == -1)
		{
			value.type = glu::TYPE_INVALID;
			valuesDst.push_back(value);
			if (uniform.isUsedInShader)
			{
				log << TestLog::Message << "// FAILURE: " << uniform.name << " was used in shader, but has location -1" << TestLog::EndMessage;
				success = false;
			}
			continue;
		}

		value.type = uniform.type;

		DE_STATIC_ASSERT(sizeof(GLint) == sizeof(value.val.intV[0]));
		DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(value.val.floatV[0]));

		if (glu::isDataTypeFloatOrVec(uniform.type) || glu::isDataTypeMatrix(uniform.type))
			GLU_CHECK_CALL(glGetUniformfv(programGL, location, &value.val.floatV[0]));
		else if (glu::isDataTypeIntOrIVec(uniform.type))
			GLU_CHECK_CALL(glGetUniformiv(programGL, location, &value.val.intV[0]));
		else if (glu::isDataTypeBoolOrBVec(uniform.type))
		{
			if (m_features & FEATURE_BOOLEANAPITYPE_INT)
			{
				GLU_CHECK_CALL(glGetUniformiv(programGL, location, &value.val.intV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.intV[i] != 0;
			}
			else // Default: use float.
			{
				GLU_CHECK_CALL(glGetUniformfv(programGL, location, &value.val.floatV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.floatV[i] != 0.0f;
			}
		}
		else if (glu::isDataTypeSampler(uniform.type))
		{
			GLint unit = -1;
			GLU_CHECK_CALL(glGetUniformiv(programGL, location, &unit));
			value.val.samplerV.unit = unit;
		}
		else
			DE_ASSERT(false);

		valuesDst.push_back(value);

		log << TestLog::Message << "// Got " << uniform.name << " value " << apiVarValueStr(value) << TestLog::EndMessage;
	}

	return success;
}